

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O3

int ncnn::cpu_support_loongson_mmi(void)

{
  return 0;
}

Assistant:

int cpu_support_loongson_mmi()
{
#if defined __ANDROID__ || defined __linux__
#if __mips__
    return g_hwcaps & HWCAP_LOONGSON_MMI;
#else
    return 0;
#endif
#else
    return 0;
#endif
}